

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O1

google_protobuf_ServiceDescriptorProto *
servicedef_toproto(upb_ToProto_Context *ctx,upb_ServiceDef *s)

{
  upb_Arena *puVar1;
  _Bool _Var2;
  int iVar3;
  upb_DecodeStatus uVar4;
  char *pcVar5;
  size_t sVar6;
  void *pvVar7;
  upb_MethodDef *m;
  google_protobuf_MethodDescriptorProto *pgVar8;
  google_protobuf_ServiceOptions *msg;
  google_protobuf_ServiceDescriptorProto *msg_00;
  anon_union_8_2_9eb4e620_for_upb_Message_0 msg_01;
  size_t sVar9;
  upb_StringView uVar10;
  size_t size;
  upb_MiniTableField field;
  size_t local_48;
  char *local_40;
  undefined4 local_38;
  
  puVar1 = ctx->arena;
  msg_00 = (google_protobuf_ServiceDescriptorProto *)puVar1->ptr_dont_copy_me__upb_internal_use_only
  ;
  if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)msg_00) < 0x30) {
    msg_00 = (google_protobuf_ServiceDescriptorProto *)
             _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,0x30);
  }
  else {
    if ((google_protobuf_ServiceDescriptorProto *)
        ((ulong)((long)&(msg_00->base_dont_copy_me__upb_internal_use_only).field_0 + 7U) &
        0xfffffffffffffff8) != msg_00) goto LAB_0031397f;
    puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg_00 + 6);
  }
  if (msg_00 == (google_protobuf_ServiceDescriptorProto *)0x0) {
    msg_00 = (google_protobuf_ServiceDescriptorProto *)0x0;
  }
  else {
    memset(msg_00,0,0x30);
  }
  if (msg_00 != (google_protobuf_ServiceDescriptorProto *)0x0) {
    pcVar5 = upb_ServiceDef_Name(s);
    sVar6 = strlen(pcVar5);
    uVar10.size = sVar6;
    uVar10.data = pcVar5;
    uVar10 = strviewdup2(ctx,uVar10);
    if (((ulong)(msg_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0) {
LAB_00313960:
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x13b,
                    "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
                   );
    }
    *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 1;
    *(upb_StringView *)(msg_00 + 2) = uVar10;
    iVar3 = upb_ServiceDef_MethodCount(s);
    local_40 = (char *)0x2000000002;
    local_38._0_2_ = 0;
    local_38._2_1_ = '\v';
    local_38._3_1_ = 0xc1;
    pvVar7 = upb_Message_ResizeArrayUninitialized
                       (&msg_00->base_dont_copy_me__upb_internal_use_only,
                        (upb_MiniTableField *)&local_40,(long)iVar3,ctx->arena);
    if (iVar3 != 0) {
      sVar9 = 0;
      do {
        m = upb_ServiceDef_Method(s,(int)sVar9);
        pgVar8 = methoddef_toproto(ctx,m);
        *(google_protobuf_MethodDescriptorProto **)((long)pvVar7 + sVar9 * 8) = pgVar8;
        sVar9 = sVar9 + 1;
      } while ((long)iVar3 != sVar9);
    }
    _Var2 = upb_ServiceDef_HasOptions(s);
    if (!_Var2) {
      return msg_00;
    }
    msg = upb_ServiceDef_Options(s);
    upb_Encode(&msg->base_dont_copy_me__upb_internal_use_only,
               &google__protobuf__ServiceOptions_msg_init,0,ctx->arena,&local_40,&local_48);
    pcVar5 = local_40;
    if (local_40 != (char *)0x0) {
      puVar1 = ctx->arena;
      msg_01.internal_opaque = (uintptr_t)puVar1->ptr_dont_copy_me__upb_internal_use_only;
      if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)msg_01) < 0x20) {
        msg_01 = (anon_union_8_2_9eb4e620_for_upb_Message_0)
                 _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,0x20);
      }
      else {
        if ((char *)((ulong)(msg_01.internal_opaque + 7) & 0xfffffffffffffff8) !=
            (char *)msg_01.internal_opaque) {
LAB_0031397f:
          __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                        ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
        }
        puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(msg_01.internal_opaque + 0x20);
      }
      if ((char *)msg_01.internal_opaque == (char *)0x0) {
        msg_01.internal_opaque = 0;
      }
      else {
        memset((void *)msg_01,0,0x20);
      }
      if (msg_01.internal_opaque == 0) {
        msg_01.internal_opaque = 0;
      }
      else {
        uVar4 = upb_Decode(pcVar5,local_48,(upb_Message *)msg_01,
                           &google__protobuf__ServiceOptions_msg_init,(upb_ExtensionRegistry *)0x0,0
                           ,puVar1);
        if (uVar4 != kUpb_DecodeStatus_Ok) {
          msg_01.internal_opaque = 0;
        }
      }
      if ((anon_union_8_2_9eb4e620_for_upb_Message_0)msg_01.internal_opaque !=
          (anon_union_8_2_9eb4e620_for_upb_Message_0)0x0) {
        if (((ulong)(msg_00->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
          *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 =
               *(byte *)&msg_00[1].base_dont_copy_me__upb_internal_use_only.field_0 | 2;
          *(anon_union_8_2_9eb4e620_for_upb_Message_0 *)(msg_00 + 5) = msg_01;
          return msg_00;
        }
        goto LAB_00313960;
      }
    }
  }
  siglongjmp((__jmp_buf_tag *)ctx->err,1);
}

Assistant:

static google_protobuf_ServiceDescriptorProto* servicedef_toproto(
    upb_ToProto_Context* ctx, const upb_ServiceDef* s) {
  google_protobuf_ServiceDescriptorProto* proto =
      google_protobuf_ServiceDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_ServiceDescriptorProto_set_name(
      proto, strviewdup(ctx, upb_ServiceDef_Name(s)));

  size_t n = upb_ServiceDef_MethodCount(s);
  google_protobuf_MethodDescriptorProto** methods =
      google_protobuf_ServiceDescriptorProto_resize_method(proto, n, ctx->arena);
  for (size_t i = 0; i < n; i++) {
    methods[i] = methoddef_toproto(ctx, upb_ServiceDef_Method(s, i));
  }

  if (upb_ServiceDef_HasOptions(s)) {
    SET_OPTIONS(proto, ServiceDescriptorProto, ServiceOptions,
                upb_ServiceDef_Options(s));
  }

  return proto;
}